

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<bool> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  AsyncInputStream *pAVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar5;
  HttpInputStreamImpl *in_RSI;
  Promise<bool> PVar6;
  PropagateException local_80 [8];
  Promise<unsigned_long> local_78;
  PropagateException local_60 [8];
  ForkedPromise<void> local_58 [2];
  ForkedPromise<void> local_38;
  undefined1 local_28 [8];
  ForkedPromise<void> fork;
  HttpInputStreamImpl *this_local;
  
  bVar2 = Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator!=
                    (&in_RSI->onMessageDone,(void *)0x0);
  if (bVar2) {
    Promise<void>::fork((Promise<void> *)local_28);
    ForkedPromise<void>::addBranch(&local_38);
    Promise<void>::operator=(&in_RSI->messageReadQueue,(Promise<void> *)&local_38);
    Promise<void>::~Promise((Promise<void> *)&local_38);
    ForkedPromise<void>::addBranch(local_58);
    Promise<void>::
    then<kj::(anonymous_namespace)::HttpInputStreamImpl::awaitNextMessage()::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)this,(Type *)local_58,local_60);
    Promise<void>::~Promise((Promise<void> *)local_58);
    ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)local_28);
    pPVar5 = extraout_RDX;
  }
  else {
    snarfBufferedLineBreak(in_RSI);
    if (((in_RSI->lineBreakBeforeNextHeader & 1U) == 0) &&
       (bVar2 = ArrayPtr<char>::operator!=(&in_RSI->leftover,(void *)0x0), bVar2)) {
      Promise<bool>::Promise((Promise<bool> *)this,true);
      pPVar5 = extraout_RDX_00;
    }
    else {
      pAVar1 = in_RSI->inner;
      pcVar3 = Array<char>::begin(&in_RSI->headerBuffer);
      sVar4 = Array<char>::size(&in_RSI->headerBuffer);
      (*pAVar1->_vptr_AsyncInputStream[1])(&local_78,pAVar1,pcVar3,1,sVar4);
      Promise<unsigned_long>::
      then<kj::(anonymous_namespace)::HttpInputStreamImpl::awaitNextMessage()::_lambda(unsigned_long)_1_,kj::_::PropagateException>
                ((Promise<unsigned_long> *)this,(Type *)&local_78,local_80);
      Promise<unsigned_long>::~Promise(&local_78);
      pPVar5 = extraout_RDX_01;
    }
  }
  PVar6.super_PromiseBase.node.ptr = pPVar5;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (onMessageDone != nullptr) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      return fork.addBranch().then([this]() {
        return awaitNextMessage();
      });
    }

    snarfBufferedLineBreak();

    if (!lineBreakBeforeNextHeader && leftover != nullptr) {
      return true;
    }

    return inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size())
        .then([this](size_t amount) -> kj::Promise<bool> {
      if (amount > 0) {
        leftover = headerBuffer.slice(0, amount);
        return awaitNextMessage();
      } else {
        return false;
      }
    });
  }